

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O3

void __thiscall
s2builderutil::LaxPolygonLayer::BuildDirected(LaxPolygonLayer *this,Graph *g,S2Error *error)

{
  int iVar1;
  undefined8 uVar2;
  DegenerateBoundaries DVar3;
  PolygonDegeneracy PVar4;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  IdSetLexicon *input_edge_id_set_lexicon;
  vector<int,_std::allocator<int>_> *label_set_ids;
  IdSetLexicon *label_set_lexicon;
  int *piVar5;
  pointer piVar6;
  pointer pPVar7;
  bool bVar8;
  ulong uVar9;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar10;
  pointer piVar11;
  pair<int,_int> *__args;
  pointer ppVar12;
  undefined8 *puVar13;
  Graph *pGVar14;
  pointer pPVar15;
  uint *puVar16;
  long lVar17;
  byte bVar18;
  vector<int,_std::allocator<int>_> local_168;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_148;
  vector<int,_std::allocator<int>_> edges_to_discard;
  vector<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
  degeneracies;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  loops;
  undefined1 local_b8 [8];
  pointer pPStack_b0;
  pointer local_a8;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  code *local_40;
  
  bVar18 = 0;
  local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
  local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
  local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  DVar3 = (this->options_).degenerate_boundaries_;
  if (DVar3 == KEEP) {
    bVar8 = IsFullyDegenerate(g);
    if (bVar8) {
LAB_001cee3c:
      MaybeAddFullLoop(g,&loops,error);
    }
  }
  else if (DVar3 == DISCARD) {
    if ((int)((ulong)((long)(g->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(g->edges_->
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) == 0)
    goto LAB_001cee3c;
  }
  else {
    FindPolygonDegeneracies(&degeneracies,g,error);
    if (error->code_ != OK) {
      if (degeneracies.
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(degeneracies.
                        super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_001cf2eb;
    }
    if ((long)degeneracies.
              super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)degeneracies.
              super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2 ==
        (long)(int)((ulong)((long)(g->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(g->edges_->
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      if (degeneracies.
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          degeneracies.
          super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        MaybeAddFullLoop(g,&loops,error);
      }
      else if ((int)*degeneracies.
                     super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                     ._M_impl.super__Vector_impl_data._M_start < 0) {
        local_b8 = (undefined1  [8])0x0;
        pPStack_b0 = (pointer)0x0;
        local_a8 = (pointer)0x0;
        std::
        vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
        ::emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                  ((vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
                    *)&loops,(vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_b8)
        ;
        if (local_b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_b8);
        }
      }
    }
    pPVar7 = degeneracies.
             super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pPVar15 = degeneracies.
              super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (degeneracies.
        super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        degeneracies.
        super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        PVar4 = *pPVar15;
        if ((DVar3 != DISCARD_HOLES) != (int)PVar4 < 0) {
          local_b8 = (undefined1  [8])(CONCAT44(local_b8._4_4_,PVar4) & 0xffffffff7fffffff);
          if (edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&edges_to_discard,
                       (iterator)
                       edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_b8);
          }
          else {
            *edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = (uint)PVar4 & 0x7fffffff;
            edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        piVar6 = edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar11 = edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar15 = pPVar15 + 1;
      } while (pPVar15 != pPVar7);
      if (edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar9 = (long)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar17 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar11,piVar6);
        piVar11 = edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            piVar11 = piVar5 + 1;
            if (piVar11 ==
                edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_001cefef;
            iVar1 = *piVar5;
            piVar5 = piVar11;
          } while (iVar1 <= *piVar11);
        }
        if (piVar11 !=
            edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
                     ,0x76,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pPStack_b0,
                     "Check failed: std::is_sorted(edges_to_discard.begin(), edges_to_discard.end()) "
                     ,0x4f);
          abort();
        }
LAB_001cefef:
        if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_148.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
                  (&local_148,
                   (long)(int)((ulong)((long)(g->edges_->
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(g->edges_->
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 3));
        std::vector<int,_std::allocator<int>_>::reserve
                  (&local_168,
                   (long)(int)((ulong)((long)(g->edges_->
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(g->edges_->
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 3));
        pvVar10 = g->edges_;
        ppVar12 = (pvVar10->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar16 = (uint *)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)(pvVar10->
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar12) >>
                     3)) {
          lVar17 = 0;
          uVar9 = 0;
          do {
            if ((puVar16 ==
                 (uint *)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish) || (uVar9 != *puVar16)) {
              __args = (pair<int,_int> *)((long)&ppVar12->first + lVar17);
              if (local_148.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_148.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>const&>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_148,
                           (iterator)
                           local_148.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__args);
              }
              else {
                *local_148.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish = *__args;
                local_148.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_148.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar1 = (g->input_edge_id_set_ids_->super__Vector_base<int,_std::allocator<int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar9];
              local_b8._0_4_ = iVar1;
              if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_168,
                           (iterator)
                           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_b8);
              }
              else {
                *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar1;
                local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              pvVar10 = g->edges_;
              ppVar12 = (pvVar10->
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              puVar16 = puVar16 + 1;
            }
            uVar9 = uVar9 + 1;
            lVar17 = lVar17 + 8;
          } while ((long)uVar9 <
                   (long)(int)((ulong)((long)(pvVar10->
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppVar12) >> 3));
        }
        if (puVar16 !=
            (uint *)edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
                     ,0x84,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pPStack_b0,"Check failed: it == edges_to_discard.end() ",0x2b);
          abort();
        }
        vertices = g->vertices_;
        input_edge_id_set_lexicon = g->input_edge_id_set_lexicon_;
        label_set_ids = g->label_set_ids_;
        label_set_lexicon = g->label_set_lexicon_;
        std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::function
                  ((function<bool_(const_S2Builder::Graph_&,_S2Error_*)> *)&local_50,
                   &g->is_full_polygon_predicate_);
        S2Builder::Graph::Graph
                  ((Graph *)local_b8,&g->options_,vertices,&local_148,&local_168,
                   input_edge_id_set_lexicon,label_set_ids,label_set_lexicon,
                   (IsFullPolygonPredicate *)&local_50);
        puVar13 = (undefined8 *)local_b8;
        pGVar14 = g;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          uVar2 = *puVar13;
          (pGVar14->options_).edge_type_ = (int)uVar2;
          (pGVar14->options_).degenerate_edges_ = (int)((ulong)uVar2 >> 0x20);
          puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
          pGVar14 = (Graph *)((long)pGVar14 + (ulong)bVar18 * -0x10 + 8);
        }
        std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::operator=
                  (&g->is_full_polygon_predicate_,
                   (function<bool_(const_S2Builder::Graph_&,_S2Error_*)> *)&local_70);
        if (local_60 != (_Manager_type)0x0) {
          (*local_60)(&local_70,&local_70,__destroy_functor);
        }
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
      }
      if (edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(edges_to_discard.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (degeneracies.
        super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(degeneracies.
                      super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_b8 = (undefined1  [8])0x0;
  pPStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pGVar14 = g;
  bVar8 = S2Builder::Graph::GetDirectedLoops
                    (g,CIRCUIT,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)local_b8,error);
  if (bVar8) {
    AppendPolygonLoops((LaxPolygonLayer *)pGVar14,g,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)local_b8,&loops);
    AppendEdgeLabels(this,g,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)local_b8);
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPStack_b0;
    degeneracies.
    super__Vector_base<s2builderutil::PolygonDegeneracy,_std::allocator<s2builderutil::PolygonDegeneracy>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_a8;
    local_b8 = (undefined1  [8])0x0;
    pPStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&degeneracies);
    ppVar12 = local_148.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pair<int,_int> *)0x0;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pair<int,_int> *)0x0;
    local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pair<int,_int> *)0x0;
    if (ppVar12 != (pair<int,_int> *)0x0) {
      operator_delete(ppVar12);
    }
    piVar11 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if (piVar11 != (int *)0x0) {
      operator_delete(piVar11);
    }
    S2LaxPolygonShape::Init(this->polygon_,&loops);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_b8);
LAB_001cf2eb:
  std::
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ::~vector(&loops);
  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LaxPolygonLayer::BuildDirected(Graph g, S2Error* error) {
  // Some cases are implemented by constructing a new graph with certain
  // degenerate edges removed (overwriting "g").  "new_edges" is where the
  // edges for the new graph are stored.
  vector<Edge> new_edges;
  vector<InputEdgeIdSetId> new_input_edge_id_set_ids;
  vector<vector<S2Point>> loops;
  auto degenerate_boundaries = options_.degenerate_boundaries();
  if (degenerate_boundaries == DegenerateBoundaries::DISCARD) {
    // This is the easiest case, since there are no degeneracies.
    if (g.num_edges() == 0) MaybeAddFullLoop(g, &loops, error);
  } else if (degenerate_boundaries == DegenerateBoundaries::KEEP) {
    // S2LaxPolygonShape doesn't need to distinguish degenerate shells from
    // holes except when the entire graph is degenerate, in which case we need
    // to decide whether it represents an empty polygons possibly with
    // degenerate shells, or a full polygon possibly with degenerate holes.
    if (s2builderutil::IsFullyDegenerate(g)) {
      MaybeAddFullLoop(g, &loops, error);
    }
  } else {
    // For DISCARD_SHELLS and DISCARD_HOLES we first determine whether any
    // degenerate loops of the given type exist, and if so we construct a new
    // graph with those edges removed (overwriting "g").
    bool discard_holes =
        (degenerate_boundaries == DegenerateBoundaries::DISCARD_HOLES);
    auto degeneracies = s2builderutil::FindPolygonDegeneracies(g, error);
    if (!error->ok()) return;
    if (degeneracies.size() == g.num_edges()) {
      if (degeneracies.empty()) {
        MaybeAddFullLoop(g, &loops, error);
      } else if (degeneracies[0].is_hole) {
        loops.push_back({});  // Full loop.
      }
    }
    vector<EdgeId> edges_to_discard;
    for (auto degeneracy : degeneracies) {
      if (degeneracy.is_hole == discard_holes) {
        edges_to_discard.push_back(degeneracy.edge_id);
      }
    }
    if (!edges_to_discard.empty()) {
      // Construct a new graph that discards the unwanted edges.
      std::sort(edges_to_discard.begin(), edges_to_discard.end());
      DiscardEdges(g, edges_to_discard, &new_edges, &new_input_edge_id_set_ids);
      g = Graph(g.options(), &g.vertices(),
                &new_edges, &new_input_edge_id_set_ids,
                &g.input_edge_id_set_lexicon(), &g.label_set_ids(),
                &g.label_set_lexicon(), g.is_full_polygon_predicate());
    }
  }
  vector<Graph::EdgeLoop> edge_loops;
  if (!g.GetDirectedLoops(LoopType::CIRCUIT, &edge_loops, error)) {
    return;
  }
  AppendPolygonLoops(g, edge_loops, &loops);
  AppendEdgeLabels(g, edge_loops);
  vector<Graph::EdgeLoop>().swap(edge_loops);  // Release memory
  vector<Edge>().swap(new_edges);
  vector<InputEdgeIdSetId>().swap(new_input_edge_id_set_ids);
  polygon_->Init(loops);
}